

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeDropTable(Btree *p,int iTable,int *piMoved)

{
  uint uVar1;
  int *piVar2;
  BtShared *pBt;
  bool bVar3;
  MemPage *pMVar4;
  u32 pgno;
  int iVar5;
  uint uVar6;
  uint uVar7;
  DbPage *pPg;
  long in_FS_OFFSET;
  MemPage *pPage;
  MemPage *local_50;
  u32 local_44;
  MemPage *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  local_40 = (MemPage *)0x0;
  pBt = p->pBt;
  if (pBt->nPage < (uint)iTable) {
    iVar5 = 0xb;
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x13c84,
                "873d4e274b4988d260ba8354a9718324a1c26187a4ab4c1cc0227c03d0f10e70");
    goto LAB_00152e55;
  }
  iVar5 = sqlite3BtreeClearTable(p,iTable,(i64 *)0x0);
  if (iVar5 != 0) goto LAB_00152e55;
  iVar5 = btreeGetPage(pBt,iTable,&local_40,0);
  pMVar4 = local_40;
  if (iVar5 == 0) {
    *piMoved = 0;
    if (pBt->autoVacuum != '\0') {
      local_44 = 0xaaaaaaaa;
      sqlite3BtreeGetMeta(p,4,&local_44);
      pMVar4 = local_40;
      pgno = local_44;
      if (local_44 == iTable) {
        iVar5 = freePage2(local_40->pBt,local_40,local_40->pgno);
        if (pMVar4 != (MemPage *)0x0) {
          sqlite3PagerUnrefNotNull(pMVar4->pDbPage);
        }
        if (iVar5 != 0) goto LAB_00152e55;
      }
      else {
        local_50 = (MemPage *)&DAT_aaaaaaaaaaaaaaaa;
        if (local_40 != (MemPage *)0x0) {
          sqlite3PagerUnrefNotNull(local_40->pDbPage);
        }
        iVar5 = btreeGetPage(pBt,pgno,&local_50,0);
        pMVar4 = local_50;
        if (iVar5 == 0) {
          iVar5 = relocatePage(pBt,local_50,'\x01',0,iTable,0);
          if (pMVar4 != (MemPage *)0x0) {
            sqlite3PagerUnrefNotNull(pMVar4->pDbPage);
          }
          if (iVar5 != 0) goto LAB_00152fe0;
          local_50 = (MemPage *)0x0;
          iVar5 = btreeGetPage(pBt,pgno,&local_50,0);
          pMVar4 = local_50;
          if (iVar5 == 0) {
            iVar5 = freePage2(local_50->pBt,local_50,local_50->pgno);
          }
          if (pMVar4 != (MemPage *)0x0) {
            sqlite3PagerUnrefNotNull(pMVar4->pDbPage);
          }
          if (iVar5 != 0) goto LAB_00152fe0;
          *piMoved = pgno;
          bVar3 = true;
        }
        else {
LAB_00152fe0:
          bVar3 = false;
        }
        if (!bVar3) goto LAB_00152e55;
      }
      uVar6 = (uint)sqlite3PendingByte / pBt->pageSize;
      do {
        do {
          uVar1 = pgno;
          local_44 = uVar1 - 1;
          pgno = local_44;
        } while ((-2 - uVar6) + local_44 == -1);
        uVar7 = 0;
        if (1 < local_44) {
          uVar1 = uVar1 - 3;
          iVar5 = uVar1 - uVar1 % (pBt->usableSize / 5 + 1);
          uVar7 = iVar5 + (uint)(iVar5 + 1U == uVar6) + 2;
        }
      } while (local_44 == uVar7);
      iVar5 = sqlite3BtreeUpdateMeta(p,4,local_44);
      goto LAB_00152e55;
    }
    iVar5 = freePage2(local_40->pBt,local_40,local_40->pgno);
    if (pMVar4 == (MemPage *)0x0) goto LAB_00152e55;
    pPg = pMVar4->pDbPage;
  }
  else {
    if (local_40 == (MemPage *)0x0) goto LAB_00152e55;
    pPg = local_40->pDbPage;
  }
  sqlite3PagerUnrefNotNull(pPg);
LAB_00152e55:
  if (p->sharable != '\0') {
    piVar2 = &p->wantToLock;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      unlockBtreeMutex(p);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar5;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeDropTable(Btree *p, int iTable, int *piMoved){
  int rc;
  sqlite3BtreeEnter(p);
  rc = btreeDropTable(p, iTable, piMoved);
  sqlite3BtreeLeave(p);
  return rc;
}